

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O0

int mbedtls_mpi_write_string(mbedtls_mpi *X,int radix,char *buf,size_t buflen,size_t *olen)

{
  bool bVar1;
  mbedtls_mpi_uint **ppmVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong in_RCX;
  mbedtls_mpi *in_RDX;
  int in_ESI;
  long *in_RDI;
  ulong *in_R8;
  size_t k;
  size_t j;
  size_t i;
  int c;
  mbedtls_mpi T;
  char *p;
  size_t n;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffff90;
  long lVar6;
  mbedtls_mpi *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char **in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  mbedtls_mpi *pmVar7;
  mbedtls_mpi *X_00;
  ulong local_40;
  int local_34;
  
  local_34 = 0;
  if ((in_ESI < 2) || (0x10 < in_ESI)) {
    return -4;
  }
  local_40 = mbedtls_mpi_bitlen((mbedtls_mpi *)0x86bde9);
  if (3 < in_ESI) {
    local_40 = local_40 >> 1;
  }
  if (0xf < in_ESI) {
    local_40 = local_40 >> 1;
  }
  uVar4 = (local_40 + 3 & 1) + local_40 + 3;
  if (in_RCX < uVar4) {
    *in_R8 = uVar4;
    return -8;
  }
  pmVar7 = in_RDX;
  mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffa8);
  X_00 = pmVar7;
  if ((short)in_RDI[1] == -1) {
    X_00 = (mbedtls_mpi *)((long)&pmVar7->p + 1);
    *(undefined1 *)&pmVar7->p = 0x2d;
  }
  if (in_ESI == 0x10) {
    bVar1 = false;
    for (uVar4 = (ulong)*(ushort *)((long)in_RDI + 10); uVar4 != 0; uVar4 = uVar4 - 1) {
      for (lVar6 = 8; lVar6 != 0; lVar6 = lVar6 + -1) {
        uVar5 = *(ulong *)(*in_RDI + (uVar4 - 1) * 8) >> (((char)lVar6 + -1) * '\b' & 0x3fU);
        uVar3 = (uint)uVar5 & 0xff;
        if ((((uVar5 & 0xff) != 0) || (bVar1)) || (uVar4 + lVar6 == 2)) {
          ppmVar2 = &X_00->p;
          *(char *)&X_00->p = "0123456789ABCDEF"[(int)(uVar3 / 0x10)];
          X_00 = (mbedtls_mpi *)((long)&X_00->p + 2);
          *(char *)((long)ppmVar2 + 1) = "0123456789ABCDEF"[(int)(uVar3 % 0x10)];
          bVar1 = true;
        }
      }
    }
  }
  else {
    local_34 = mbedtls_mpi_copy(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if ((local_34 != 0) ||
       (local_34 = mpi_write_hlp(X_00,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)),
       local_34 != 0)) goto LAB_0086c059;
  }
  *(undefined1 *)&X_00->p = 0;
  *in_R8 = (long)X_00 + (1 - (long)in_RDX);
LAB_0086c059:
  mbedtls_mpi_free((mbedtls_mpi *)0x86c063);
  return local_34;
}

Assistant:

int mbedtls_mpi_write_string(const mbedtls_mpi *X, int radix,
                             char *buf, size_t buflen, size_t *olen)
{
    int ret = 0;
    size_t n;
    char *p;
    mbedtls_mpi T;

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    n = mbedtls_mpi_bitlen(X);   /* Number of bits necessary to present `n`. */
    if (radix >=  4) {
        n >>= 1;                 /* Number of 4-adic digits necessary to present
                                  * `n`. If radix > 4, this might be a strict
                                  * overapproximation of the number of
                                  * radix-adic digits needed to present `n`. */
    }
    if (radix >= 16) {
        n >>= 1;                 /* Number of hexadecimal digits necessary to
                                  * present `n`. */

    }
    n += 1; /* Terminating null byte */
    n += 1; /* Compensate for the divisions above, which round down `n`
             * in case it's not even. */
    n += 1; /* Potential '-'-sign. */
    n += (n & 1);   /* Make n even to have enough space for hexadecimal writing,
                     * which always uses an even number of hex-digits. */

    if (buflen < n) {
        *olen = n;
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    p = buf;
    mbedtls_mpi_init(&T);

    if (X->s == -1) {
        *p++ = '-';
        buflen--;
    }

    if (radix == 16) {
        int c;
        size_t i, j, k;

        for (i = X->n, k = 0; i > 0; i--) {
            for (j = ciL; j > 0; j--) {
                c = (X->p[i - 1] >> ((j - 1) << 3)) & 0xFF;

                if (c == 0 && k == 0 && (i + j) != 2) {
                    continue;
                }

                *(p++) = "0123456789ABCDEF" [c / 16];
                *(p++) = "0123456789ABCDEF" [c % 16];
                k = 1;
            }
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&T, X));

        if (T.s == -1) {
            T.s = 1;
        }

        MBEDTLS_MPI_CHK(mpi_write_hlp(&T, radix, &p, buflen));
    }

    *p++ = '\0';
    *olen = (size_t) (p - buf);

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}